

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O1

void * crnd::crnd_realloc(void *p,size_t size,size_t *pActual_size,bool movable)

{
  void *pvVar1;
  char *pcVar2;
  size_t actual_size;
  size_t local_218 [65];
  
  if (((ulong)p & 7) == 0) {
    if (size < 0x7fff0001) {
      local_218[0] = size;
      pvVar1 = (void *)(*(code *)g_pRealloc)();
      if (pActual_size == (size_t *)0x0) {
        return pvVar1;
      }
      *pActual_size = local_218[0];
      return pvVar1;
    }
    pcVar2 = "crnd_malloc: size too big";
  }
  else {
    pcVar2 = "crnd_realloc: bad ptr";
  }
  sprintf((char *)local_218,"%s(%u): Assertion failure: \"%s\"\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/zellski[P]crunch/crnlib/../inc/crn_decomp.h"
          ,0x7c9,pcVar2);
  puts((char *)local_218);
  return (void *)0x0;
}

Assistant:

void* crnd_realloc(void* p, size_t size, size_t* pActual_size, bool movable) {
  if ((uint32) reinterpret_cast<uintptr_t>(p) & (CRND_MIN_ALLOC_ALIGNMENT - 1)) {
    crnd_mem_error("crnd_realloc: bad ptr");
    return NULL;
  }

  if (size > MAX_POSSIBLE_BLOCK_SIZE) {
    crnd_mem_error("crnd_malloc: size too big");
    return NULL;
  }

  size_t actual_size = size;
  void* p_new = (*g_pRealloc)(p, size, &actual_size, movable, g_pUser_data);

  if (pActual_size)
    *pActual_size = actual_size;

  CRND_ASSERT(((uint32) reinterpret_cast<uintptr_t>(p_new) & (CRND_MIN_ALLOC_ALIGNMENT - 1)) == 0);

  return p_new;
}